

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddSharedLibNoSOName(cmComputeLinkInformation *this,string *item)

{
  string file;
  string sStack_38;
  
  cmsys::SystemTools::GetFilenameName(&sStack_38,item);
  AddUserItem(this,&sStack_38,false);
  cmOrderDirectories::AddLinkLibrary(this->OrderLinkerSearchPath,item);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void cmComputeLinkInformation::AddSharedLibNoSOName(std::string const& item)
{
  // We have a full path to a shared library with no soname.  We need
  // to ask the linker to locate the item because otherwise the path
  // we give to it will be embedded in the target linked.  Then at
  // runtime the dynamic linker will search for the library using the
  // path instead of just the name.
  std::string file = cmSystemTools::GetFilenameName(item);
  this->AddUserItem(file, false);

  // Make sure the link directory ordering will find the library.
  this->OrderLinkerSearchPath->AddLinkLibrary(item);
}